

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

void __thiscall ColorTest_red_Test::TestBody(ColorTest_red_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  color color_value;
  color color_rgb;
  uint local_30;
  undefined4 uStack_2c;
  uint local_28 [2];
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  color local_10;
  color local_c;
  
  local_10.m_value = 0xff0000;
  local_c.m_value = 0xff0000;
  testing::internal::CmpHelperEQ<jessilib::io::color,jessilib::io::color>
            (local_20,"color_value","color_rgb",&local_10,&local_c);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/io/color.cpp"
               ,0x20,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_28);
    if ((long *)CONCAT44(uStack_2c,local_30) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_2c,local_30) + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_30 = local_10.m_value;
  local_28[0] = 0xff0000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_20,"color_value.value()","0xFF0000U",&local_30,local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/io/color.cpp"
               ,0x21,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_28);
    if ((long *)CONCAT44(uStack_2c,local_30) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_2c,local_30) + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_28[0] = CONCAT31(local_28[0]._1_3_,local_10.m_value._2_1_);
  local_30 = 0xff;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            (local_20,"color_value.red()","0xFF",(uchar *)local_28,(int *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/io/color.cpp"
               ,0x22,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_28);
    if ((long *)CONCAT44(uStack_2c,local_30) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_2c,local_30) + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_28[0] = CONCAT31(local_28[0]._1_3_,local_10.m_value._1_1_);
  local_30 = 0;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            (local_20,"color_value.green()","0x00",(uchar *)local_28,(int *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/io/color.cpp"
               ,0x23,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_28);
    if ((long *)CONCAT44(uStack_2c,local_30) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_2c,local_30) + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  local_28[0] = CONCAT31(local_28[0]._1_3_,(undefined1)local_10.m_value);
  local_30 = 0;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            (local_20,"color_value.blue()","0x00",(uchar *)local_28,(int *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/io/color.cpp"
               ,0x24,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_28);
    if ((long *)CONCAT44(uStack_2c,local_30) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_2c,local_30) + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  return;
}

Assistant:

TEST(ColorTest, red) {
	color color_value{ 0xFF0000 };
	color color_rgb{ 0xFF, 0, 0 };

	EXPECT_EQ(color_value, color_rgb);
	EXPECT_EQ(color_value.value(), 0xFF0000U);
	EXPECT_EQ(color_value.red(), 0xFF);
	EXPECT_EQ(color_value.green(), 0x00);
	EXPECT_EQ(color_value.blue(), 0x00);
}